

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O3

bsc_step_t
bsc_bcast_2phase(bsc_step_t depends,bsp_pid_t root,bsc_group_t group,bsc_coll_params_t *params,
                bsc_size_t n)

{
  ulong uVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  bsp_pid_t bVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  bsp_pid_t bVar13;
  request_t *prVar14;
  long lVar15;
  bsc_size_t block_remaining;
  int iVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int local_bc;
  int local_b8;
  int local_b4;
  
  if (group == (bsc_group_t)0x0) {
    uVar9 = bsp_nprocs();
    uVar10 = bsp_pid();
  }
  else {
    uVar9 = *group;
    lVar15 = *(long *)((long)group + 8);
    bVar8 = bsp_pid();
    uVar10 = *(uint *)(lVar15 + (long)bVar8 * 4);
  }
  if (n < 1) {
    iVar16 = 0;
  }
  else {
    lVar15 = 0;
    iVar16 = 0;
    do {
      iVar16 = iVar16 + *(int *)((long)&params->size + lVar15);
      lVar15 = lVar15 + 0x30;
    } while ((ulong)(uint)n * 0x30 != lVar15);
  }
  if (0 < (int)uVar9) {
    iVar11 = (int)(uVar9 + iVar16 + -1) / (int)uVar9;
    local_b4 = -1;
    local_b8 = -1;
    local_bc = -1;
    uVar19 = 0;
    iVar20 = 0;
    iVar18 = 0;
    do {
      iVar12 = iVar11 * (int)uVar19;
      if (iVar16 <= iVar12) {
        iVar12 = iVar16;
      }
      uVar1 = uVar19 + 1;
      iVar17 = (int)uVar1 * iVar11;
      if (iVar16 <= iVar17) {
        iVar17 = iVar16;
      }
      iVar17 = iVar17 - iVar12;
      iVar12 = iVar18;
      iVar21 = iVar20;
      if (uVar19 == uVar10) {
        local_b8 = iVar17;
      }
      do {
        iVar22 = iVar17 + iVar21;
        iVar2 = params[iVar12].size;
        bVar6 = iVar2 < iVar22;
        iVar7 = iVar2;
        if (iVar22 < iVar2) {
          iVar7 = iVar22;
        }
        if (iVar2 < iVar22) {
          iVar22 = 0;
        }
        pvVar3 = params[iVar12].src;
        pvVar4 = params[iVar12].dst;
        bVar8 = bsp_pid();
        if (bVar8 == root) {
          bVar8 = (int)uVar19;
          if (group != (bsc_group_t)0x0) {
            bVar8 = *(bsp_pid_t *)(*(long *)((long)group + 0x10) + uVar19 * 4);
          }
          bVar13 = bsp_pid();
          prVar14 = new_request(depends);
          prVar14->kind = PUT;
          (prVar14->payload).put.src_addr = (void *)((long)pvVar3 + (long)iVar21);
          (prVar14->payload).put.dst_addr = pvVar4;
          (prVar14->payload).put.src_pid = bVar13;
          (prVar14->payload).put.dst_pid = bVar8;
          (prVar14->payload).put.size = iVar7 - iVar21;
          (prVar14->payload).put.offset = iVar21;
        }
        iVar12 = iVar12 + (uint)bVar6;
        iVar17 = (iVar21 - iVar7) + iVar17;
        iVar21 = iVar22;
      } while (0 < iVar17);
      if (uVar19 == uVar10) {
        local_b4 = iVar18;
        local_bc = iVar20;
      }
      uVar19 = uVar1;
      iVar20 = iVar22;
      iVar18 = iVar12;
    } while (uVar1 != uVar9);
    if (0 < (int)uVar9) {
      uVar19 = 0;
      iVar16 = local_bc;
      iVar20 = local_b8;
      iVar18 = local_b4;
      do {
        iVar11 = iVar20 + iVar16;
        iVar12 = params[iVar18].size;
        bVar6 = iVar12 < iVar11;
        iVar17 = iVar12;
        if (iVar11 < iVar12) {
          iVar17 = iVar11;
        }
        if (iVar12 < iVar11) {
          iVar11 = 0;
        }
        bVar8 = (bsp_pid_t)uVar19;
        if (group != (bsc_group_t)0x0) {
          bVar8 = *(bsp_pid_t *)(*(long *)((long)group + 0x10) + uVar19 * 4);
        }
        pvVar3 = params[iVar18].dst;
        iVar17 = iVar17 - iVar16;
        bVar13 = bsp_pid();
        prVar14 = new_request(depends + 1);
        prVar14->kind = PUT;
        (prVar14->payload).put.src_addr = (void *)((long)pvVar3 + (long)iVar16);
        (prVar14->payload).put.dst_addr = pvVar3;
        (prVar14->payload).put.src_pid = bVar13;
        (prVar14->payload).put.dst_pid = bVar8;
        (prVar14->payload).put.size = iVar17;
        (prVar14->payload).put.offset = iVar16;
        iVar12 = iVar20 - iVar17;
        bVar5 = iVar17 <= iVar20;
        iVar16 = iVar11;
        iVar20 = iVar12;
        iVar18 = iVar18 + (uint)bVar6;
      } while ((iVar12 != 0 && bVar5) ||
              (uVar19 = uVar19 + 1, iVar16 = local_bc, iVar20 = local_b8, iVar18 = local_b4,
              uVar19 != uVar9));
    }
  }
  return depends + 2;
}

Assistant:

DLL_PUBLIC bsc_step_t bsc_bcast_2phase( bsc_step_t depends,
                      bsp_pid_t root, bsc_group_t group, 
                      bsc_coll_params_t * params, bsc_size_t n )
{
    const group_t * g = group;
    bsc_pid_t P = g?g->size:bsp_nprocs() ;
    bsc_pid_t s = g?g->lid[bsp_pid()]:bsp_pid();
    bsc_size_t i, total_size = 0;
    bsc_size_t block;
    bsc_size_t b, my_start_b=-1, my_block_size=-1;
    bsc_size_t j, my_start_j=-1;
    const char * src_bytes;
    char * dst_bytes;
 
    /* compute preferred block size */
    for ( i = 0 ; i < n; ++i )
        total_size += params[i].size;
    block = (total_size + P - 1)/P;
   
    /* the root scatters, all compute the block for the
     * following all-gather */
    b = 0; j = 0;
    for ( i = 0 ; i < P; ++i) {
        bsc_size_t block_begin = MIN(     i*block, total_size);
        bsc_size_t block_end   = MIN( (i+1)*block, total_size);
        bsc_size_t block_remaining = block_end - block_begin;

        if (i == s ) {
            my_start_j = j;
            my_start_b = b;
            my_block_size = block_remaining;
        }
        
        do {
            bsc_size_t e = b + block_remaining;
            bsc_size_t next_b = e;
            bsc_size_t next_j = j;
            if (e > params[j].size) {
                e = params[j].size;
                next_j = j+1;
                next_b = 0;
            }
            src_bytes = params[j].src;
            dst_bytes = params[j].dst;
            if (bsp_pid() == root ) 
                bsc_put( depends, g?g->gid[i]:i, 
                        src_bytes + b, dst_bytes, b, e - b);
            block_remaining -= (e-b);
            j = next_j;
            b = next_b;
        } while ( block_remaining > 0 ) ;

    }
    depends += 1;
    /* the all-gather */
    for ( i = 0; i < P; ++i ) {
        bsc_size_t block_remaining = my_block_size;
        b = my_start_b;
        j = my_start_j;

        do {
            bsc_size_t e = b + block_remaining;
            bsc_size_t next_b = e;
            bsc_size_t next_j = j;
            if (e > params[j].size) {
                e = params[j].size;
                next_j = j+1;
                next_b = 0;
            }
            src_bytes = params[j].src;
            dst_bytes = params[j].dst;
            bsc_put( depends, g?g->gid[i]:i, 
                    dst_bytes + b, dst_bytes, b, e - b);
            block_remaining -= (e-b);
            j = next_j;
            b = next_b;
        } while ( block_remaining > 0 ) ;
    }
    return depends+1;
}